

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_format(jit_State *J,RecordFFData *rd,TRef hdr,int sbufx)

{
  bool bVar1;
  TRef TVar2;
  TRef TVar3;
  SFormat k;
  uint uVar4;
  GCobj *pGVar5;
  IRRef1 IVar6;
  ulong uVar7;
  IRCallID IVar8;
  ulong uVar9;
  IRRef1 IVar10;
  FormatState fs;
  uint local_64;
  FormatState local_50;
  
  uVar9 = (ulong)(uint)sbufx;
  TVar2 = lj_ir_tostr(J,J->base[uVar9]);
  pGVar5 = (GCobj *)argv2str(J,rd->argv + uVar9);
  TVar3 = lj_ir_kgc(J,pGVar5,IRT_STR);
  (J->fold).ins.field_0.ot = 0x884;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
  lj_opt_fold(J);
  local_50.p = (uint8_t *)&(pGVar5->gch).gclist;
  local_50.e = (uint8_t *)((long)pGVar5 + (ulong)(pGVar5->str).len + 0x18);
  local_64 = hdr;
  do {
    k = lj_strfmt_parse(&local_50);
    IVar6 = (IRRef1)local_64;
    if (k == 2) {
      uVar7 = 0;
    }
    else {
      if (k == 0) {
        if (sbufx != 0) {
          (J->fold).ins.field_0.op1 = IVar6;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x12000000;
          lj_opt_fold(J);
          return;
        }
        (J->fold).ins.field_0.ot = 0x5784;
        (J->fold).ins.field_0.op1 = IVar6;
        (J->fold).ins.field_0.op2 = (IRRef1)hdr;
        TVar2 = lj_opt_fold(J);
        *J->base = TVar2;
        return;
      }
      uVar7 = (ulong)J->base[uVar9 + 1];
      uVar9 = uVar9 + 1;
    }
    TVar2 = lj_ir_kint(J,k);
    IVar10 = (IRRef1)uVar7;
    uVar4 = (uint)uVar7;
    switch(k & 0xf) {
    case 2:
      pGVar5 = (GCobj *)lj_str_new(J->L,local_50.str,(ulong)local_50.len);
      TVar2 = lj_ir_kgc(J,pGVar5,IRT_STR);
      IVar10 = (IRRef1)TVar2;
LAB_0015905b:
      (J->fold).ins.field_0.ot = 0x5689;
      (J->fold).ins.field_0.op1 = IVar6;
      (J->fold).ins.field_0.op2 = IVar10;
      break;
    case 3:
      IVar8 = IRCALL_lj_strfmt_putfnum_int;
      goto LAB_00158f6d;
    case 4:
      IVar8 = IRCALL_lj_strfmt_putfnum_uint;
LAB_00158f6d:
      if (((uint)(uVar7 >> 0x18) & 0x1f) - 0xf < 5) {
        if (k == 3) {
          (J->fold).ins.field_0.op1 = IVar10;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5d040000;
          TVar2 = lj_opt_fold(J);
          (J->fold).ins.field_0.ot = 0x5689;
          (J->fold).ins.field_0.op1 = IVar6;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
          local_64 = lj_opt_fold(J);
        }
        else {
          (J->fold).ins.field_0.op1 = IVar10;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b160ad3;
          uVar4 = lj_opt_fold(J);
          IVar8 = IRCALL_lj_strfmt_putfxint;
LAB_001590a2:
          local_64 = lj_ir_call(J,IVar8,(ulong)local_64,(ulong)TVar2,(ulong)uVar4);
        }
      }
      else {
        if ((uVar4 & 0x1f000000) != 0xa000000) {
LAB_0015901a:
          uVar4 = lj_ir_tonum(J,uVar4);
          goto LAB_001590a2;
        }
        TVar3 = lj_crecord_loadiu64(J,uVar4,rd->argv + uVar9);
        local_64 = lj_ir_call(J,IRCALL_lj_strfmt_putfxint,(ulong)local_64,(ulong)TVar2,(ulong)TVar3)
        ;
      }
      bVar1 = true;
      goto LAB_001590f9;
    case 5:
      IVar8 = IRCALL_lj_strfmt_putfnum;
      goto LAB_0015901a;
    case 6:
      if ((uVar4 & 0x1f000000) != 0x4000000) goto switchD_00158ed1_default;
      if (k != 6) {
        if ((k & 0x10) == 0) {
          IVar8 = IRCALL_lj_strfmt_putfstr;
          goto LAB_001590ec;
        }
        local_64 = lj_ir_call(J,IRCALL_lj_strfmt_putquoted,(ulong)local_64,uVar7);
        goto LAB_001590f3;
      }
      (J->fold).ins.field_0.ot = 0x5689;
      (J->fold).ins.field_0.op1 = IVar6;
      (J->fold).ins.field_0.op2 = IVar10;
      break;
    case 7:
      TVar3 = lj_opt_narrow_toint(J,uVar4);
      if (k == 7) {
        (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5d040002;
        TVar2 = lj_opt_fold(J);
        IVar10 = (IRRef1)TVar2;
        goto LAB_0015905b;
      }
      IVar8 = IRCALL_lj_strfmt_putfchar;
      uVar7 = (ulong)TVar3;
LAB_001590ec:
      local_64 = lj_ir_call(J,IVar8,(ulong)local_64,(ulong)TVar2,uVar7);
      goto LAB_001590f3;
    default:
switchD_00158ed1_default:
      recff_nyi(J,rd);
      bVar1 = false;
      goto LAB_001590f9;
    }
    local_64 = lj_opt_fold(J);
LAB_001590f3:
    bVar1 = true;
LAB_001590f9:
    if (!bVar1) {
      return;
    }
  } while( true );
}

Assistant:

static void recff_format(jit_State *J, RecordFFData *rd, TRef hdr, int sbufx)
{
  ptrdiff_t arg = sbufx;
  TRef tr = hdr, trfmt = lj_ir_tostr(J, J->base[arg]);
  GCstr *fmt = argv2str(J, &rd->argv[arg]);
  FormatState fs;
  SFormat sf;
  /* Specialize to the format string. */
  emitir(IRTG(IR_EQ, IRT_STR), trfmt, lj_ir_kstr(J, fmt));
  lj_strfmt_init(&fs, strdata(fmt), fmt->len);
  while ((sf = lj_strfmt_parse(&fs)) != STRFMT_EOF) {  /* Parse format. */
    TRef tra = sf == STRFMT_LIT ? 0 : J->base[++arg];
    TRef trsf = lj_ir_kint(J, (int32_t)sf);
    IRCallID id;
    switch (STRFMT_TYPE(sf)) {
    case STRFMT_LIT:
      tr = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr,
		  lj_ir_kstr(J, lj_str_new(J->L, fs.str, fs.len)));
      break;
    case STRFMT_INT:
      id = IRCALL_lj_strfmt_putfnum_int;
    handle_int:
      if (!tref_isinteger(tra)) {
#if LJ_HASFFI
	if (tref_iscdata(tra)) {
	  tra = lj_crecord_loadiu64(J, tra, &rd->argv[arg]);
	  tr = lj_ir_call(J, IRCALL_lj_strfmt_putfxint, tr, trsf, tra);
	  break;
	}
#endif
	goto handle_num;
      }
      if (sf == STRFMT_INT) { /* Shortcut for plain %d. */
	tr = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr,
		    emitir(IRT(IR_TOSTR, IRT_STR), tra, IRTOSTR_INT));
      } else {
#if LJ_HASFFI
	tra = emitir(IRT(IR_CONV, IRT_U64), tra,
		     (IRT_INT|(IRT_U64<<5)|IRCONV_SEXT));
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putfxint, tr, trsf, tra);
	lj_needsplit(J);
#else
	recff_nyiu(J, rd);  /* Don't bother working around this NYI. */
	return;
#endif
      }
      break;
    case STRFMT_UINT:
      id = IRCALL_lj_strfmt_putfnum_uint;
      goto handle_int;
    case STRFMT_NUM:
      id = IRCALL_lj_strfmt_putfnum;
    handle_num:
      tra = lj_ir_tonum(J, tra);
      tr = lj_ir_call(J, id, tr, trsf, tra);
      if (LJ_SOFTFP32) lj_needsplit(J);
      break;
    case STRFMT_STR:
      if (!tref_isstr(tra)) {
	recff_nyiu(J, rd);  /* NYI: __tostring and non-string types for %s. */
	/* NYI: also buffers. */
	return;
      }
      if (sf == STRFMT_STR)  /* Shortcut for plain %s. */
	tr = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr, tra);
      else if ((sf & STRFMT_T_QUOTED))
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putquoted, tr, tra);
      else
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putfstr, tr, trsf, tra);
      break;
    case STRFMT_CHAR:
      tra = lj_opt_narrow_toint(J, tra);
      if (sf == STRFMT_CHAR)  /* Shortcut for plain %c. */
	tr = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr,
		    emitir(IRT(IR_TOSTR, IRT_STR), tra, IRTOSTR_CHAR));
      else
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putfchar, tr, trsf, tra);
      break;
    case STRFMT_PTR:  /* NYI */
    case STRFMT_ERR:
    default:
      recff_nyiu(J, rd);
      return;
    }
  }
  if (sbufx) {
    emitir(IRT(IR_USE, IRT_NIL), tr, 0);
  } else {
    J->base[0] = emitir(IRTG(IR_BUFSTR, IRT_STR), tr, hdr);
  }
}